

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath)

{
  cmMakefile *pcVar1;
  cmValue cVar2;
  string *psVar3;
  string stdLibString;
  string libPathTerminator;
  string libPathFlag;
  string linkLanguage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a0;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar3 = &pcli->LinkLanguage;
  local_a0 = linkLibraries;
  local_98 = linkPath;
  std::__cxx11::string::string((string *)&local_50,(string *)psVar3);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_100,(string *)psVar3);
  std::operator+(&local_e0,"CMAKE_",&local_100);
  std::operator+(&local_c0,&local_e0,"_LIBRARY_PATH_FLAG");
  cVar2 = cmMakefile::GetDefinition(pcVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  if (cVar2.Value == (string *)0x0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"CMAKE_LIBRARY_PATH_FLAG",(allocator<char> *)&local_e0);
    cmMakefile::GetRequiredDefinition(pcVar1,&local_c0);
    std::__cxx11::string::_M_assign((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_90,(string *)psVar3);
  std::operator+(&local_100,"CMAKE_",&local_90);
  std::operator+(&local_e0,&local_100,"_LIBRARY_PATH_TERMINATOR");
  cVar2 = cmMakefile::GetDefinition(pcVar1,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_90);
  if (cVar2.Value == (string *)0x0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"CMAKE_LIBRARY_PATH_TERMINATOR",(allocator<char> *)&local_100);
    cmMakefile::GetRequiredDefinition(pcVar1,&local_e0);
    std::__cxx11::string::_M_assign((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_c0);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_90,(string *)psVar3);
  cmStrCat<char_const(&)[7],std::__cxx11::string,char_const(&)[20]>
            (&local_100,(char (*) [7])0x72f1a0,&local_90,(char (*) [20])"_STANDARD_LIBRARIES");
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_100);
  std::__cxx11::string::string((string *)&local_e0,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_90);
  pcVar1 = this->Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[23]>
            (&local_100,(char (*) [7])0x72f1a0,&local_50,(char (*) [23])0x724e9d);
  cVar2 = cmMakefile::GetDefinition(pcVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  cmLinkLineComputer::ComputeFrameworkPath_abi_cxx11_(&local_100,linkLineComputer,pcli,cVar2);
  std::__cxx11::string::operator=((string *)frameworkPath,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  cmLinkLineComputer::ComputeLinkPath(linkLineComputer,pcli,&local_70,&local_c0,local_98);
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])(linkLineComputer,pcli,&local_e0,local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::vector<BT<std::string>>& linkLibraries, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag;
  if (cmValue value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_FLAG")) {
    libPathFlag = *value;
  } else {
    libPathFlag =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  }

  std::string libPathTerminator;
  if (cmValue value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_TERMINATOR")) {
    libPathTerminator = *value;
  } else {
    libPathTerminator =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");
  }

  // Add standard libraries for this language.
  std::string stdLibString = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", cli.GetLinkLanguage(), "_STANDARD_LIBRARIES"));

  // Append the framework search path flags.
  cmValue fwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", linkLanguage, "_FRAMEWORK_SEARCH_FLAG"));

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator,
                                    linkPath);
  linkLineComputer->ComputeLinkLibraries(cli, stdLibString, linkLibraries);
}